

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

ostream * yyml::operator<<(ostream *os,Tensor<double> *v)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ulong uVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((v->shape_).total == 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>(v->data_[uVar2]);
      uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (v->shape_).total - 1);
  }
  std::ostream::_M_insert<double>(v->data_[uVar2]);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Tensor& v) {
    size_t i;
    for (i = 0; i < v.shape_.total - 1; i++) {
      os << v.data_[i] << ' ';
    }
    os << v.data_[i];
    return os;
  }